

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

lysp_node ** lysp_node_child_p(lysp_node *node)

{
  uint16_t uVar1;
  lysp_node *node_local;
  
  if (node != (lysp_node *)0x0) {
    uVar1 = node->nodetype;
    if (uVar1 == 1) {
      node_local = (lysp_node *)&node[1].ref;
    }
    else if (uVar1 == 2) {
      node_local = node + 1;
    }
    else if (uVar1 == 0x10) {
      node_local = (lysp_node *)&node[1].ref;
    }
    else if (uVar1 == 0x80) {
      node_local = node + 1;
    }
    else if (uVar1 == 0x400) {
      node_local = (lysp_node *)&node[1].name;
    }
    else if ((uVar1 == 0x1000) || (uVar1 == 0x2000)) {
      node_local = (lysp_node *)&node[1].name;
    }
    else if (uVar1 == 0x4000) {
      node_local = (lysp_node *)&node[1].next;
    }
    else if (uVar1 == 0x8000) {
      node_local = node + 1;
    }
    else {
      node_local = (lysp_node *)0x0;
    }
    return &node_local->parent;
  }
  __assert_fail("node",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_common.c"
                ,0x5d4,"struct lysp_node **lysp_node_child_p(struct lysp_node *)");
}

Assistant:

struct lysp_node **
lysp_node_child_p(struct lysp_node *node)
{
    assert(node);
    switch (node->nodetype) {
    case LYS_CONTAINER:
        return &((struct lysp_node_container *)node)->child;
    case LYS_CHOICE:
        return &((struct lysp_node_choice *)node)->child;
    case LYS_LIST:
        return &((struct lysp_node_list *)node)->child;
    case LYS_CASE:
        return &((struct lysp_node_case *)node)->child;
    case LYS_GROUPING:
        return &((struct lysp_node_grp *)node)->child;
    case LYS_AUGMENT:
        return &((struct lysp_node_augment *)node)->child;
    case LYS_INPUT:
    case LYS_OUTPUT:
        return &((struct lysp_node_action_inout *)node)->child;
    case LYS_NOTIF:
        return &((struct lysp_node_notif *)node)->child;
    default:
        return NULL;
    }
}